

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_heat1D_adapt.c
# Opt level: O2

sunrealtype * adapt_mesh(N_Vector y,sunindextype *Nnew,UserData udata)

{
  double *pdVar1;
  sunrealtype *psVar2;
  int iVar3;
  void *flagvalue;
  void *__ptr;
  long lVar4;
  size_t sVar5;
  sunrealtype *__ptr_00;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  size_t __nmemb;
  double dVar10;
  
  psVar2 = udata->x;
  flagvalue = (void *)N_VGetArrayPointer();
  iVar3 = check_flag(flagvalue,"N_VGetArrayPointer",0);
  if (iVar3 == 0) {
    lVar7 = udata->N;
    __nmemb = lVar7 - 1;
    __ptr = calloc(__nmemb,4);
    for (lVar4 = 1; lVar4 < (long)__nmemb; lVar4 = lVar4 + 1) {
      dVar10 = *(double *)((long)flagvalue + lVar4 * 8);
      dVar10 = ABS((*(double *)((long)flagvalue + lVar4 * 8 + -8) - (dVar10 + dVar10)) +
                   *(double *)((long)flagvalue + lVar4 * 8 + 8));
      if (udata->refine_tol <= dVar10 && dVar10 != udata->refine_tol) {
        *(undefined8 *)((long)__ptr + lVar4 * 4 + -4) = 0x100000001;
      }
    }
    sVar5 = 0;
    if ((long)__nmemb < 1) {
      __nmemb = sVar5;
    }
    lVar4 = 0;
    for (; __nmemb != sVar5; sVar5 = sVar5 + 1) {
      lVar4 = lVar4 + (ulong)(*(int *)((long)__ptr + sVar5 * 4) == 1);
    }
    lVar9 = lVar7 + lVar4;
    *Nnew = lVar9;
    __ptr_00 = (sunrealtype *)malloc(lVar9 * 8);
    *__ptr_00 = *psVar2;
    lVar8 = udata->N;
    lVar4 = lVar7 + lVar4 + -1;
    lVar7 = 1;
    lVar6 = lVar8;
    if (lVar8 < 2) {
      lVar6 = lVar7;
    }
    __ptr_00[lVar9 + -1] = psVar2[lVar8 + -1];
    for (lVar8 = 0; lVar6 + -1 != lVar8; lVar8 = lVar8 + 1) {
      iVar3 = *(int *)((long)__ptr + lVar8 * 4);
      if (iVar3 == 1) {
        dVar10 = psVar2[lVar8 + 1];
        __ptr_00[lVar7] = (psVar2[lVar8] + dVar10) * 0.5;
        __ptr_00[lVar7 + 1] = dVar10;
        lVar7 = lVar7 + 2;
      }
      else if (iVar3 == 0) {
        __ptr_00[lVar7] = psVar2[lVar8 + 1];
        lVar7 = lVar7 + 1;
      }
    }
    lVar7 = 0;
    if (lVar4 < 1) {
      lVar4 = lVar7;
    }
    do {
      if (lVar4 == lVar7) {
        free(__ptr);
        return __ptr_00;
      }
      pdVar1 = __ptr_00 + lVar7;
      lVar8 = lVar7 + 1;
      lVar7 = lVar7 + 1;
    } while (*pdVar1 < __ptr_00[lVar8]);
    fwrite("adapt_mesh error: illegal mesh created\n",0x27,1,_stderr);
    free(__ptr_00);
  }
  return (sunrealtype *)0x0;
}

Assistant:

sunrealtype* adapt_mesh(N_Vector y, sunindextype* Nnew, UserData udata)
{
  sunindextype i, j;
  int* marks = NULL;
  sunrealtype ydd, *xold = NULL, *Y = NULL, *xnew = NULL;
  sunindextype num_refine, N_new;

  /* Access current solution and mesh arrays */
  xold = udata->x;
  Y    = N_VGetArrayPointer(y);
  if (check_flag((void*)Y, "N_VGetArrayPointer", 0)) { return NULL; }

  /* create marking array */
  marks = calloc(udata->N - 1, sizeof(int));

  /* perform marking:
      0 -> leave alone
      1 -> refine */
  for (i = 1; i < udata->N - 1; i++)
  {
    /* approximate scaled second-derivative */
    ydd = Y[i - 1] - TWO * Y[i] + Y[i + 1];

    /* check for refinement */
    if (SUNRabs(ydd) > udata->refine_tol)
    {
      marks[i - 1] = 1;
      marks[i]     = 1;
    }
  }

  /* allocate new mesh */
  num_refine = 0;
  for (i = 0; i < udata->N - 1; i++)
  {
    if (marks[i] == 1) { num_refine++; }
  }
  N_new = udata->N + num_refine;
  *Nnew = N_new; /* Store new array length */
  xnew  = malloc((N_new) * sizeof(sunrealtype));

  /* fill new mesh */
  xnew[0]         = xold[0]; /* store endpoints */
  xnew[N_new - 1] = xold[udata->N - 1];
  j               = 1;
  /* iterate over old intervals */
  for (i = 0; i < udata->N - 1; i++)
  {
    /* if mark is 0, reuse old interval */
    if (marks[i] == 0)
    {
      xnew[j++] = xold[i + 1];
      continue;
    }

    /* if mark is 1, refine old interval */
    if (marks[i] == 1)
    {
      xnew[j++] = PT5 * (xold[i] + xold[i + 1]);
      xnew[j++] = xold[i + 1];
      continue;
    }
  }

  /* verify that new mesh is legal */
  for (i = 0; i < N_new - 1; i++)
  {
    if (xnew[i + 1] <= xnew[i])
    {
      fprintf(stderr, "adapt_mesh error: illegal mesh created\n");
      free(xnew);
      return NULL;
    }
  }

  free(marks); /* Delete marking array */
  return xnew; /* Return with success */
}